

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O2

void __thiscall wasm::SSAify::createNewIndexes(SSAify *this,LocalGraph *graph)

{
  LocalSet *set;
  bool bVar1;
  Index IVar2;
  Type type;
  undefined1 auVar3 [8];
  undefined1 local_48 [8];
  FindAll<wasm::LocalSet> sets;
  
  FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)local_48,this->func->body);
  auVar3 = local_48;
  do {
    if (auVar3 == (undefined1  [8])
                  sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
                ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_48);
      return;
    }
    set = *(LocalSet **)auVar3;
    bVar1 = LocalGraph::isSSA(graph,set->index);
    if (!bVar1) {
      if (this->allowMerges == false) {
        bVar1 = hasMerges(this,set,graph);
        if (bVar1) goto LAB_009c2dce;
      }
      type = Function::getLocalType(this->func,set->index);
      IVar2 = addLocal(this,type);
      set->index = IVar2;
    }
LAB_009c2dce:
    auVar3 = (undefined1  [8])((long)auVar3 + 8);
  } while( true );
}

Assistant:

void createNewIndexes(LocalGraph& graph) {
    FindAll<LocalSet> sets(func->body);
    for (auto* set : sets.list) {
      // Indexes already in SSA form do not need to be modified - there is
      // already just one set for that index. Otherwise, use a new index, unless
      // merges are disallowed.
      if (!graph.isSSA(set->index) && (allowMerges || !hasMerges(set, graph))) {
        set->index = addLocal(func->getLocalType(set->index));
      }
    }
  }